

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O1

void xrep0_sock_getq_cb(void *arg)

{
  nni_aio *aio;
  nni_msgq *mq;
  nng_err nVar1;
  uint32_t uVar2;
  int iVar3;
  nni_msg *m;
  size_t sVar4;
  void *pvVar5;
  
  mq = *arg;
  aio = (nni_aio *)((long)arg + 0x78);
  nVar1 = nni_aio_result(aio);
  if (nVar1 != NNG_OK) {
    return;
  }
  m = nni_aio_get_msg(aio);
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  sVar4 = nni_msg_header_len(m);
  if (sVar4 < 4) {
    nni_msg_free(m);
    goto LAB_0011f8fd;
  }
  uVar2 = nni_msg_header_trim_u32(m);
  nni_mtx_lock((nni_mtx *)((long)arg + 0x10));
  pvVar5 = nni_id_get((nni_id_map *)((long)arg + 0x40),(ulong)uVar2);
  if (pvVar5 == (void *)0x0) {
LAB_0011f8ec:
    nni_msg_free(m);
  }
  else {
    iVar3 = nni_msgq_tryput(*(nni_msgq **)((long)pvVar5 + 0x10),m);
    if (iVar3 != 0) goto LAB_0011f8ec;
  }
  nni_mtx_unlock((nni_mtx *)((long)arg + 0x10));
LAB_0011f8fd:
  nni_msgq_aio_get(mq,aio);
  return;
}

Assistant:

static void
xrep0_sock_getq_cb(void *arg)
{
	xrep0_sock *s   = arg;
	nni_msgq   *uwq = s->uwq;
	nni_msg    *msg;
	uint32_t    id;
	xrep0_pipe *p;

	// This watches for messages from the upper write queue,
	// extracts the destination pipe, and forwards it to the appropriate
	// destination pipe via a separate queue.  This prevents a single bad
	// or slow pipe from gumming up the works for the entire socket.

	if (nni_aio_result(&s->aio_getq) != 0) {
		// Closed socket?
		return;
	}

	msg = nni_aio_get_msg(&s->aio_getq);
	nni_aio_set_msg(&s->aio_getq, NULL);

	// We yank the outgoing pipe id from the header
	if (nni_msg_header_len(msg) < 4) {
		nni_msg_free(msg);

		// Look for another message on the upper write queue.
		nni_msgq_aio_get(uwq, &s->aio_getq);
		return;
	}

	id = nni_msg_header_trim_u32(msg);

	// Look for the pipe, and attempt to put the message there
	// (non-blocking) if we can.  If we can't for any reason, then we
	// free the message.
	nni_mtx_lock(&s->lk);
	if (((p = nni_id_get(&s->pipes, id)) == NULL) ||
	    (nni_msgq_tryput(p->sendq, msg) != 0)) {
		nni_msg_free(msg);
	}
	nni_mtx_unlock(&s->lk);

	// Now look for another message on the upper write queue.
	nni_msgq_aio_get(uwq, &s->aio_getq);
}